

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3Fts3EvalPhrasePoslist(Fts3Cursor *pCsr,Fts3Expr *pExpr,int iCol,char **ppOut)

{
  byte bVar1;
  Fts3Phrase *pFVar2;
  sqlite3_vtab *psVar3;
  char *pcVar4;
  bool bVar5;
  bool bVar6;
  sqlite3_int64 sVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  Fts3Expr *pFVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  char *pcVar15;
  u8 uVar16;
  int rc;
  char *local_78;
  int iThis;
  uint uStack_6c;
  sqlite3_int64 iDocid;
  char local_60;
  undefined7 uStack_5f;
  int local_54;
  Fts3Expr *local_50;
  int local_44;
  Fts3Phrase *local_40;
  char **local_38;
  
  pFVar2 = pExpr->pPhrase;
  psVar3 = (pCsr->base).pVtab;
  *ppOut = (char *)0x0;
  if ((pFVar2->iColumn == iCol) || (*(int *)&psVar3[2].pModule <= pFVar2->iColumn)) {
    iDocid = pExpr->iDocid;
    local_78 = (pFVar2->doclist).pList;
    local_54 = iCol;
    local_50 = (Fts3Expr *)iDocid;
    local_38 = ppOut;
    if (((Fts3Expr *)iDocid == (Fts3Expr *)pCsr->iPrevId) && (pExpr->bEof == '\0')) {
LAB_001ae5b4:
      iVar8 = 0;
      if (local_78 != (char *)0x0) {
        if (*local_78 == '\x01') {
          pcVar15 = local_78 + 1;
          if (local_78[1] < '\0') {
            local_78 = pcVar15;
            uVar10 = sqlite3Fts3GetVarint32(pcVar15,&iThis);
            uVar12 = (ulong)uVar10;
          }
          else {
            _iThis = (char *)CONCAT44(uStack_6c,(int)local_78[1]);
            uVar12 = 1;
          }
          local_78 = pcVar15 + uVar12;
        }
        else {
          _iThis = (char *)((ulong)uStack_6c << 0x20);
        }
        while (iThis < local_54) {
          fts3ColumnlistCopy((char **)0x0,&local_78);
          if (*local_78 == '\0') {
            return 0;
          }
          pcVar15 = local_78 + 1;
          if (local_78[1] < '\0') {
            uVar10 = sqlite3Fts3GetVarint32(pcVar15,&iThis);
            uVar12 = (ulong)uVar10;
          }
          else {
            _iThis = (char *)CONCAT44(uStack_6c,(int)local_78[1]);
            uVar12 = 1;
          }
          local_78 = pcVar15 + uVar12;
        }
        if (*local_78 == '\0') {
          local_78 = (char *)0x0;
        }
        if (iThis != local_54) {
          local_78 = (char *)0x0;
        }
        *local_38 = local_78;
        iVar8 = 0;
      }
    }
    else {
      rc = 0;
      bVar1 = *(byte *)((long)&psVar3[0x12].zErrMsg + 7);
      bVar5 = false;
      iVar9 = 1;
      bVar6 = false;
      pFVar11 = pExpr;
      while (pFVar11 = pFVar11->pParent, pFVar11 != (Fts3Expr *)0x0) {
        if (pFVar11->eType == 4) {
          bVar5 = true;
        }
        if (pFVar11->eType == 1) {
          pExpr = pFVar11;
        }
        if (pFVar11->bEof != '\0') {
          bVar6 = true;
        }
      }
      if (bVar5) {
        local_40 = pFVar2;
        if (pFVar2->bIncr == 0) {
LAB_001ae386:
          iVar8 = 0;
        }
        else {
          uVar16 = pExpr->bEof;
          fts3EvalRestart(pCsr,pExpr,&rc);
          do {
            if (rc != 0) {
              return rc;
            }
            if (pExpr->bEof != '\0') goto LAB_001ae386;
            fts3EvalNextRow(pCsr,pExpr,&rc);
          } while ((uVar16 != '\0') || (iVar8 = rc, (Fts3Expr *)pExpr->iDocid != local_50));
        }
        if (iVar8 == 0 && bVar6) {
          do {
            if (pExpr->bEof != '\0') goto LAB_001ae594;
            fts3EvalNextRow(pCsr,pExpr,&rc);
            iVar8 = rc;
          } while (rc == 0);
        }
        else if (iVar8 == 0) {
LAB_001ae594:
          if (pExpr != (Fts3Expr *)0x0) {
            pFVar11 = pExpr;
            if (pExpr->eType == 1) {
              pFVar11 = pExpr->pRight;
            }
            pFVar2 = pFVar11->pPhrase;
            pcVar15 = pFVar2->pOrPoslist;
            iDocid = pFVar2->iOrDocid;
            iVar8 = (pFVar2->doclist).nAll;
            local_78 = pcVar15;
            local_50 = pExpr;
            if (pCsr->bDesc != bVar1) {
              if (iVar8 == 0) {
                local_60 = '\x01';
              }
              else if (pcVar15 == (char *)0x0) {
                local_60 = '\0';
              }
              else {
                local_60 = pcVar15 <= (pFVar2->doclist).aAll;
              }
              do {
                uVar16 = local_60;
                if (local_78 == (char *)0x0) {
                  if (local_60 != '\0') {
                    pcVar15 = (char *)0x0;
                    goto LAB_001ae571;
                  }
                }
                else {
                  lVar13 = iDocid - pCsr->iPrevId;
                  lVar14 = -lVar13;
                  if (bVar1 == 0) {
                    lVar14 = lVar13;
                  }
                  pcVar15 = local_78;
                  if ((lVar14 < 1) || (local_60 != '\0')) goto LAB_001ae571;
                }
                sqlite3Fts3DoclistPrev
                          ((uint)bVar1,(pFVar2->doclist).aAll,(pFVar2->doclist).nAll,&local_78,
                           &iDocid,&iThis,(u8 *)&local_60);
              } while( true );
            }
            local_44 = iVar9;
            if (iVar8 == 0) goto LAB_001ae4bc;
            uVar16 = (pFVar2->doclist).aAll + iVar8 <= pcVar15;
            do {
              while (sVar7 = iDocid, iVar9 = local_44, pcVar15 == (char *)0x0) {
                if ((bool)uVar16 != false) goto LAB_001ae571;
                pcVar15 = (pFVar2->doclist).aAll;
                iVar9 = sqlite3Fts3GetVarint(pcVar15,&iDocid);
                pcVar15 = pcVar15 + iVar9;
LAB_001ae560:
                uVar16 = false;
              }
              lVar13 = iDocid - pCsr->iPrevId;
              lVar14 = -lVar13;
              if (bVar1 == 0) {
                lVar14 = lVar13;
              }
              if ((-1 < lVar14) || ((bool)uVar16 != false)) goto LAB_001ae571;
              iVar9 = (pFVar2->doclist).nAll;
              pcVar4 = (pFVar2->doclist).aAll;
              _iThis = pcVar15;
              fts3PoslistCopy((char **)0x0,(char **)&iThis);
              for (pcVar15 = _iThis; pcVar15 < pcVar4 + iVar9; pcVar15 = pcVar15 + 1) {
                if (*pcVar15 != '\0') {
                  iVar9 = sqlite3Fts3GetVarint(pcVar15,(sqlite_int64 *)&local_60);
                  pcVar15 = pcVar15 + iVar9;
                  lVar14 = -CONCAT71(uStack_5f,local_60);
                  if (bVar1 == 0) {
                    lVar14 = CONCAT71(uStack_5f,local_60);
                  }
                  iDocid = sVar7 + lVar14;
                  goto LAB_001ae560;
                }
              }
LAB_001ae4bc:
              uVar16 = true;
            } while( true );
          }
          if (iVar9 == 0) {
            local_78 = (char *)0x0;
          }
          else {
            local_78 = local_40->pOrPoslist;
          }
          goto LAB_001ae5b4;
        }
      }
      else {
        iVar8 = 0;
      }
    }
  }
  else {
    iVar8 = 0;
  }
  return iVar8;
LAB_001ae571:
  pFVar2->pOrPoslist = pcVar15;
  pFVar2->iOrDocid = iDocid;
  if ((uVar16 != '\0') || (iDocid != pCsr->iPrevId)) {
    iVar9 = 0;
  }
  pExpr = local_50->pLeft;
  goto LAB_001ae594;
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3EvalPhrasePoslist(
  Fts3Cursor *pCsr,               /* FTS3 cursor object */
  Fts3Expr *pExpr,                /* Phrase to return doclist for */
  int iCol,                       /* Column to return position list for */
  char **ppOut                    /* OUT: Pointer to position list */
){
  Fts3Phrase *pPhrase = pExpr->pPhrase;
  Fts3Table *pTab = (Fts3Table *)pCsr->base.pVtab;
  char *pIter;
  int iThis;
  sqlite3_int64 iDocid;

  /* If this phrase is applies specifically to some column other than 
  ** column iCol, return a NULL pointer.  */
  *ppOut = 0;
  assert( iCol>=0 && iCol<pTab->nColumn );
  if( (pPhrase->iColumn<pTab->nColumn && pPhrase->iColumn!=iCol) ){
    return SQLITE_OK;
  }

  iDocid = pExpr->iDocid;
  pIter = pPhrase->doclist.pList;
  if( iDocid!=pCsr->iPrevId || pExpr->bEof ){
    int rc = SQLITE_OK;
    int bDescDoclist = pTab->bDescIdx;      /* For DOCID_CMP macro */
    int bOr = 0;
    u8 bTreeEof = 0;
    Fts3Expr *p;                  /* Used to iterate from pExpr to root */
    Fts3Expr *pNear;              /* Most senior NEAR ancestor (or pExpr) */
    int bMatch;

    /* Check if this phrase descends from an OR expression node. If not, 
    ** return NULL. Otherwise, the entry that corresponds to docid 
    ** pCsr->iPrevId may lie earlier in the doclist buffer. Or, if the
    ** tree that the node is part of has been marked as EOF, but the node
    ** itself is not EOF, then it may point to an earlier entry. */
    pNear = pExpr;
    for(p=pExpr->pParent; p; p=p->pParent){
      if( p->eType==FTSQUERY_OR ) bOr = 1;
      if( p->eType==FTSQUERY_NEAR ) pNear = p;
      if( p->bEof ) bTreeEof = 1;
    }
    if( bOr==0 ) return SQLITE_OK;

    /* This is the descendent of an OR node. In this case we cannot use
    ** an incremental phrase. Load the entire doclist for the phrase
    ** into memory in this case.  */
    if( pPhrase->bIncr ){
      int bEofSave = pNear->bEof;
      fts3EvalRestart(pCsr, pNear, &rc);
      while( rc==SQLITE_OK && !pNear->bEof ){
        fts3EvalNextRow(pCsr, pNear, &rc);
        if( bEofSave==0 && pNear->iDocid==iDocid ) break;
      }
      assert( rc!=SQLITE_OK || pPhrase->bIncr==0 );
    }
    if( bTreeEof ){
      while( rc==SQLITE_OK && !pNear->bEof ){
        fts3EvalNextRow(pCsr, pNear, &rc);
      }
    }
    if( rc!=SQLITE_OK ) return rc;

    bMatch = 1;
    for(p=pNear; p; p=p->pLeft){
      u8 bEof = 0;
      Fts3Expr *pTest = p;
      Fts3Phrase *pPh;
      assert( pTest->eType==FTSQUERY_NEAR || pTest->eType==FTSQUERY_PHRASE );
      if( pTest->eType==FTSQUERY_NEAR ) pTest = pTest->pRight;
      assert( pTest->eType==FTSQUERY_PHRASE );
      pPh = pTest->pPhrase;

      pIter = pPh->pOrPoslist;
      iDocid = pPh->iOrDocid;
      if( pCsr->bDesc==bDescDoclist ){
        bEof = !pPh->doclist.nAll ||
          (pIter >= (pPh->doclist.aAll + pPh->doclist.nAll));
        while( (pIter==0 || DOCID_CMP(iDocid, pCsr->iPrevId)<0 ) && bEof==0 ){
          sqlite3Fts3DoclistNext(
              bDescDoclist, pPh->doclist.aAll, pPh->doclist.nAll, 
              &pIter, &iDocid, &bEof
          );
        }
      }else{
        bEof = !pPh->doclist.nAll || (pIter && pIter<=pPh->doclist.aAll);
        while( (pIter==0 || DOCID_CMP(iDocid, pCsr->iPrevId)>0 ) && bEof==0 ){
          int dummy;
          sqlite3Fts3DoclistPrev(
              bDescDoclist, pPh->doclist.aAll, pPh->doclist.nAll, 
              &pIter, &iDocid, &dummy, &bEof
              );
        }
      }
      pPh->pOrPoslist = pIter;
      pPh->iOrDocid = iDocid;
      if( bEof || iDocid!=pCsr->iPrevId ) bMatch = 0;
    }

    if( bMatch ){
      pIter = pPhrase->pOrPoslist;
    }else{
      pIter = 0;
    }
  }
  if( pIter==0 ) return SQLITE_OK;

  if( *pIter==0x01 ){
    pIter++;
    pIter += fts3GetVarint32(pIter, &iThis);
  }else{
    iThis = 0;
  }
  while( iThis<iCol ){
    fts3ColumnlistCopy(0, &pIter);
    if( *pIter==0x00 ) return SQLITE_OK;
    pIter++;
    pIter += fts3GetVarint32(pIter, &iThis);
  }
  if( *pIter==0x00 ){
    pIter = 0;
  }

  *ppOut = ((iCol==iThis)?pIter:0);
  return SQLITE_OK;
}